

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O0

_Bool PPC_alias_insn(char *name,ppc_alias *alias)

{
  int iVar1;
  ulong uStack_28;
  int x;
  size_t i;
  ppc_alias *alias_local;
  char *name_local;
  
  uStack_28 = 0;
  while( true ) {
    if (0x4f < uStack_28) {
      iVar1 = name2id(insn_name_maps + 1,0x3a5,name);
      if (iVar1 != -1) {
        alias->id = insn_name_maps[iVar1].id;
        alias->cc = 0;
      }
      return iVar1 != -1;
    }
    iVar1 = strcmp(name,alias_insn_name_maps[uStack_28].mnem);
    if (iVar1 == 0) break;
    uStack_28 = uStack_28 + 1;
  }
  alias->id = alias_insn_name_maps[uStack_28].id;
  alias->cc = alias_insn_name_maps[uStack_28].cc;
  return true;
}

Assistant:

bool PPC_alias_insn(const char *name, struct ppc_alias *alias)
{
	size_t i;
#ifndef CAPSTONE_DIET
	int x;
#endif

	for(i = 0; i < ARR_SIZE(alias_insn_name_maps); i++) {
		if (!strcmp(name, alias_insn_name_maps[i].mnem)) {
			alias->id = alias_insn_name_maps[i].id;
			alias->cc = alias_insn_name_maps[i].cc;
			return true;
		}
	}

#ifndef CAPSTONE_DIET
	// not really an alias insn
	x = name2id(&insn_name_maps[1], ARR_SIZE(insn_name_maps) - 1, name);
	if (x != -1) {
		alias->id = insn_name_maps[x].id;
		alias->cc = PPC_BC_INVALID;
		return true;
	}
#endif

	// not found
	return false;
}